

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detection.cpp
# Opt level: O3

int __thiscall ncnn::Yolov3Detection::load_param(Yolov3Detection *this,ParamDict *pd)

{
  void *__ptr;
  Allocator *pAVar1;
  int iVar2;
  int *piVar3;
  float fVar4;
  Mat local_98;
  Mat local_58;
  
  iVar2 = ParamDict::get(pd,0,0x14);
  this->classes = iVar2;
  iVar2 = ParamDict::get(pd,1,5);
  this->box_num = iVar2;
  iVar2 = ParamDict::get(pd,2,1);
  this->softmax_enable = iVar2;
  fVar4 = ParamDict::get(pd,3,0.25);
  this->confidence_threshold = fVar4;
  fVar4 = ParamDict::get(pd,4,0.45);
  this->nms_threshold = fVar4;
  iVar2 = ParamDict::get(pd,5,0);
  this->net_width = iVar2;
  iVar2 = ParamDict::get(pd,6,0);
  this->net_height = iVar2;
  local_58.elemsize._0_4_ = 0;
  local_58._20_8_ = 0;
  local_58.data = (void *)0x0;
  local_58.refcount._0_4_ = 0;
  local_58.refcount._4_4_ = 0;
  local_58.allocator = (Allocator *)0x0;
  local_58.dims = 0;
  local_58.w = 0;
  local_58.h = 0;
  local_58.c = 0;
  local_58.cstep = 0;
  ParamDict::get(&local_98,pd,7,&local_58);
  piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
  if (&this->biases != &local_98) {
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (this->biases).refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        __ptr = (this->biases).data;
        pAVar1 = (this->biases).allocator;
        if (pAVar1 == (Allocator *)0x0) {
          if (__ptr != (void *)0x0) {
            free(__ptr);
          }
        }
        else {
          (**(code **)(*(long *)pAVar1 + 0x18))();
        }
      }
    }
    (this->biases).data = local_98.data;
    piVar3 = (int *)CONCAT44(local_98.refcount._4_4_,local_98.refcount._0_4_);
    (this->biases).refcount = piVar3;
    (this->biases).elemsize = CONCAT44(local_98.elemsize._4_4_,(undefined4)local_98.elemsize);
    (this->biases).elempack = local_98.elempack;
    (this->biases).allocator = local_98.allocator;
    (this->biases).dims = local_98.dims;
    (this->biases).w = local_98.w;
    (this->biases).h = local_98.h;
    (this->biases).c = local_98.c;
    (this->biases).cstep = local_98.cstep;
  }
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_98.allocator == (Allocator *)0x0) {
        if (local_98.data != (void *)0x0) {
          free(local_98.data);
        }
      }
      else {
        (**(code **)(*(long *)local_98.allocator + 0x18))();
      }
    }
  }
  local_98.elemsize._0_4_ = 0;
  local_98.elemsize._4_4_ = 0;
  local_98.elempack = 0;
  local_98.data = (void *)0x0;
  local_98.refcount._0_4_ = 0;
  local_98.refcount._4_4_ = 0;
  local_98.dims = 0;
  local_98.w = 0;
  local_98.h = 0;
  local_98.c = 0;
  local_98.cstep = 0;
  piVar3 = (int *)CONCAT44(local_58.refcount._4_4_,local_58.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_58.allocator == (Allocator *)0x0) {
        if (local_58.data != (void *)0x0) {
          free(local_58.data);
        }
      }
      else {
        (**(code **)(*(long *)local_58.allocator + 0x18))();
      }
    }
  }
  return 0;
}

Assistant:

int Yolov3Detection::load_param(const ParamDict &pd)
{
    classes = pd.get(0, 20);
    box_num = pd.get(1, 5);
    softmax_enable = pd.get(2, 1);
    confidence_threshold = pd.get(3, 0.25f);
    nms_threshold = pd.get(4, 0.45f);
    net_width = pd.get(5, 0);
    net_height = pd.get(6, 0);
    biases = pd.get(7, Mat());
    return 0;
}